

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

timestamp_t
duckdb::TryCastCInternal<duckdb_blob,duckdb::timestamp_t,duckdb::FromCBlobCastWrapper>
          (duckdb_result *result,idx_t col,idx_t row)

{
  timestamp_t tVar1;
  
  tVar1 = FetchDefaultValue::Operation<duckdb::timestamp_t>();
  return (timestamp_t)tVar1.value;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}